

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coin.cpp
# Opt level: O2

void node::FindCoins(NodeContext *node,
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *coins)

{
  long lVar1;
  uint __line;
  char *pcVar2;
  bool bVar3;
  Chainstate *this;
  CCoinsViewCache *baseIn;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  CCoinsViewMemPool mempool_view;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((node->mempool)._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl == (CTxMemPool *)0x0) {
    pcVar2 = "!node.mempool";
    __line = 0xe;
  }
  else {
    if ((node->chainman)._M_t.
        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
        super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0)
    {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock1,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/coin.cpp"
                 ,0x10,false);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock2,
                 &((node->mempool)._M_t.
                   super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                   super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs,"node.mempool->cs",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/coin.cpp"
                 ,0x10,false);
      this = ChainstateManager::ActiveChainstate
                       ((node->chainman)._M_t.
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      baseIn = Chainstate::CoinsTip(this);
      CCoinsViewMemPool::CCoinsViewMemPool
                (&mempool_view,(CCoinsView *)baseIn,
                 (node->mempool)._M_t.
                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                 super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
      for (p_Var4 = (coins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(coins->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        bVar3 = CCoinsViewMemPool::GetCoin
                          (&mempool_view,(COutPoint *)(p_Var4 + 1),(Coin *)&p_Var4[2]._M_parent);
        if (!bVar3) {
          Coin::Clear((Coin *)&p_Var4[2]._M_parent);
        }
      }
      CCoinsViewMemPool::~CCoinsViewMemPool(&mempool_view);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    pcVar2 = "!node.chainman";
    __line = 0xf;
  }
  __assert_fail(pcVar2 + 1,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/coin.cpp"
                ,__line,"void node::FindCoins(const NodeContext &, std::map<COutPoint, Coin> &)");
}

Assistant:

void FindCoins(const NodeContext& node, std::map<COutPoint, Coin>& coins)
{
    assert(node.mempool);
    assert(node.chainman);
    LOCK2(cs_main, node.mempool->cs);
    CCoinsViewCache& chain_view = node.chainman->ActiveChainstate().CoinsTip();
    CCoinsViewMemPool mempool_view(&chain_view, *node.mempool);
    for (auto& coin : coins) {
        if (!mempool_view.GetCoin(coin.first, coin.second)) {
            // Either the coin is not in the CCoinsViewCache or is spent. Clear it.
            coin.second.Clear();
        }
    }
}